

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

LPWSTR GetCommandLineW(void)

{
  char16_t *local_18;
  LPWSTR lpwstr;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (g_lpwstrCmdLine == (LPWSTR)0x0) {
    local_18 = L"";
  }
  else {
    local_18 = g_lpwstrCmdLine;
  }
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  return local_18;
}

Assistant:

LPWSTR
PALAPI
GetCommandLineW(
    VOID)
{
    PERF_ENTRY(GetCommandLineW);
    ENTRY("GetCommandLineW()\n");

    LPWSTR lpwstr = g_lpwstrCmdLine ? g_lpwstrCmdLine : (LPWSTR)W("");

    LOGEXIT("GetCommandLineW returns LPWSTR %p (%S)\n",
          g_lpwstrCmdLine,
          lpwstr);
    PERF_EXIT(GetCommandLineW);

    return lpwstr;
}